

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

char * __thiscall
Messages::AddressBook::_InternalParse(AddressBook *this,char *ptr,ParseContext *ctx)

{
  Arena *this_00;
  bool bVar1;
  Person *msg;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  ulong uVar3;
  uint local_4c;
  Arena *pAStack_48;
  uint32 tag;
  Arena *arena;
  ParseContext *ctx_local;
  char *ptr_local;
  AddressBook *this_local;
  UnknownFieldSet *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  arena = (Arena *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  pAStack_48 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done
                        ((ParseContext *)arena,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_4c,0)
      ;
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      if ((local_4c >> 3 != 1) || ((local_4c & 0xff) != 10)) break;
      ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.factory + 7);
      do {
        this_00 = arena;
        ctx_local = (ParseContext *)&ctx_local->field_0x1;
        msg = _internal_add_people(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage<Messages::Person>
                              ((ParseContext *)this_00,msg,(char *)ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                          ((EpsCopyInputStream *)arena,(char *)ctx_local);
      } while ((bVar1) &&
              (bVar1 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar1));
    }
    if (((local_4c & 7) == 4) || (local_4c == 0)) {
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                ((EpsCopyInputStream *)arena,local_4c);
      return (char *)ctx_local;
    }
    uVar3 = (ulong)local_4c;
    this_local = (AddressBook *)&this->field_0x8;
    local_18 = (undefined1 *)this_local;
    local_10 = (undefined1 *)this_local;
    if (((uint)*(undefined8 *)this_local & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)this_local);
      local_20 = &pCVar2->unknown_fields;
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                           ((InternalMetadata *)this_local);
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (uVar3,local_20,(char *)ctx_local,(ParseContext *)arena);
  } while (ctx_local != (ParseContext *)0x0);
  return (char *)0x0;
}

Assistant:

const char* AddressBook::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .Messages.Person people = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_people(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}